

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

optional<unsigned_long> __thiscall
tsbp::TwoStepBranchingProcedure::Branch(TwoStepBranchingProcedure *this,size_t nodeId)

{
  type_conflict1 tVar1;
  bool bVar2;
  size_type num_bits;
  unsigned_long v;
  vertex_bundled *pvVar3;
  reference piVar4;
  allocator<unsigned_long> *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar5;
  vec_adj_list_impl<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar6;
  reference rVar7;
  optional<unsigned_long> oVar8;
  byte local_24a;
  _Storage<unsigned_long,_true> local_218;
  _Storage<unsigned_long,_true> local_210;
  pair<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_bool> local_208;
  undefined1 local_1e8 [24];
  vertices_size_type local_1d0;
  vertex_descriptor leftNodeId_1;
  block_type local_1c0;
  int local_1b4;
  iterator iStack_1b0;
  int i;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  Node *targetNode;
  vertex_descriptor targetId;
  tuples local_170 [16];
  pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>_>
  local_160;
  allocator<unsigned_long> local_139;
  undefined1 local_138 [8];
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> attemptedItemIds;
  edge_descriptor outEdge;
  undefined1 local_f8 [8];
  out_edge_iterator outEdgeEndIterator;
  out_edge_iterator outEdgeIterator;
  undefined1 local_a8 [24];
  vertices_size_type local_90;
  vertex_descriptor leftNodeId;
  _Node_iterator_base<unsigned_long,_false> local_80;
  undefined1 local_78;
  int local_6c;
  _Node_iterator_base<unsigned_long,_false> local_68;
  undefined1 local_60;
  size_type local_58;
  size_t numberOfRemainingItems;
  size_t numberOfOutgoingEdges;
  PackingRelaxed2D *packing;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *placedItems;
  Node *currentNode;
  size_t nodeId_local;
  TwoStepBranchingProcedure *this_local;
  optional<unsigned_long> newNodeId;
  
  currentNode = (Node *)nodeId;
  nodeId_local = (size_t)this;
  placedItems = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                boost::
                adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>
                ::operator[](&this->tree,nodeId);
  local_38 = Node::PlacedItems((Node *)placedItems);
  if (*(int *)&(placedItems->m_bits).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish == 6) {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
    uVar5 = extraout_RDX;
  }
  else {
    numberOfOutgoingEdges =
         (size_t)std::
                 unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>::
                 operator*((unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
                            *)&(placedItems->m_bits).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    numberOfRemainingItems =
         boost::
         out_degree<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                   ((vertex_descriptor)currentNode,
                    (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
                     *)&this->tree);
    local_58 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                         ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (numberOfOutgoingEdges + 0x38));
    if (numberOfRemainingItems == local_58) {
      pVar6 = std::
              unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
              ::emplace<unsigned_long&>
                        ((unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
                          *)&this->nodesToDeactivate,(unsigned_long *)&currentNode);
      local_68._M_cur =
           (__node_type *)pVar6.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
      local_60 = pVar6.second;
      if (*(int *)&(placedItems->m_bits).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish == 1) {
        local_6c = 0;
        pVar6 = std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::emplace<int>(&this->nodesToDeactivate,&local_6c);
        local_80._M_cur =
             (__node_type *)pVar6.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
        local_78 = pVar6.second;
        std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
        uVar5 = extraout_RDX_00;
      }
      else if (*(int *)((long)&(placedItems->m_bits).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4) == 1) {
        std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
        uVar5 = extraout_RDX_01;
      }
      else {
        local_90 = boost::
                   num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                             ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
                               *)&this->tree);
        local_a8._0_4_ = -1;
        local_a8._4_4_ = DeactivatePlacement;
        local_a8._8_4_ = NotEvaluated;
        std::make_unique<tsbp::PackingRelaxed2D,tsbp::PackingRelaxed2D_const&>
                  ((PackingRelaxed2D *)(local_a8 + 0x10));
        AddLeafNode(this,(Node *)local_a8);
        Node::~Node((Node *)local_a8);
        boost::
        add_edge<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                  ((pair<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_bool> *)
                   &outEdgeIterator.m_src,(boost *)currentNode,local_90,
                   (vertex_descriptor)&this->tree,in_R8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&this->activeNodes,&local_90);
        std::optional<unsigned_long>::optional<unsigned_long,_true>
                  ((optional<unsigned_long> *)&this_local,&local_90);
        uVar5 = extraout_RDX_02;
      }
    }
    else {
      boost::detail::
      out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>
      ::out_edge_iter((out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>
                       *)&outEdgeEndIterator.m_src);
      boost::detail::
      out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>
      ::out_edge_iter((out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>
                       *)local_f8);
      boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>::edge_desc_impl
                ((edge_desc_impl<boost::directed_tag,_unsigned_long> *)&attemptedItemIds.m_num_bits)
      ;
      num_bits = std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size(&this->items);
      this_00 = &local_139;
      std::allocator<unsigned_long>::allocator(this_00);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_138,num_bits
                 ,0,this_00);
      std::allocator<unsigned_long>::~allocator(&local_139);
      boost::
      out_edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                (&local_160,(boost *)currentNode,(vertex_descriptor)&this->tree,
                 (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
                  *)this_00);
      boost::tuples::
      tie<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>*,std::vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>*,std::vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>>
                (local_170,
                 (out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>
                  *)&outEdgeEndIterator.m_src,
                 (out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>
                  *)local_f8);
      boost::tuples::
      tuple<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>*,std::vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>&,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>*,std::vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
      ::operator=((tuple<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>*,std::vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>&,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>*,std::vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
                   *)local_170,&local_160);
      while (tVar1 = boost::iterators::operator!=
                               ((iterator_facade<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>
                                 *)&outEdgeEndIterator.m_src,
                                (iterator_facade<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>
                                 *)local_f8), tVar1) {
        boost::iterators::detail::
        iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long,_false,_false>
        ::operator*((reference *)&targetId,
                    (iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long,_false,_false>
                     *)&outEdgeEndIterator.m_src);
        attemptedItemIds.m_num_bits = targetId;
        v = boost::
            target<boost::directed_tag,unsigned_long,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>
                      ((edge_base<boost::directed_tag,_unsigned_long> *)&attemptedItemIds.m_num_bits
                       ,&this->tree);
        pvVar3 = boost::
                 adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>
                 ::operator[](&this->tree,v);
        if (-1 < (pvVar3->super_BaseNode).ItemIdToPlace) {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_138,
                     (long)(pvVar3->super_BaseNode).ItemIdToPlace,true);
        }
        boost::iterators::detail::
        iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long,_false,_false>
        ::operator++((iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long,_false,_false>
                      *)&outEdgeEndIterator.m_src);
      }
      std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
      __end1 = std::vector<int,_std::allocator<int>_>::begin(&this->branchingOrder);
      iStack_1b0 = std::vector<int,_std::allocator<int>_>::end(&this->branchingOrder);
      while (bVar2 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                               (&__end1,&stack0xfffffffffffffe50), ((bVar2 ^ 0xffU) & 1) != 0) {
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end1);
        local_1b4 = *piVar4;
        bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (local_38,(long)local_1b4);
        local_24a = 1;
        if (!bVar2) {
          rVar7 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                             local_138,(long)local_1b4);
          local_1c0 = rVar7.m_mask;
          leftNodeId_1 = (vertex_descriptor)rVar7.m_block;
          bVar2 = boost::dynamic_bitset::reference::operator_cast_to_bool
                            ((reference *)&leftNodeId_1);
          local_24a = 1;
          if (!bVar2) {
            bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                               (numberOfOutgoingEdges + 0x38),(long)local_1b4);
            local_24a = bVar2 ^ 0xff;
          }
        }
        if ((local_24a & 1) == 0) {
          local_1d0 = boost::
                      num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                                ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
                                  *)&this->tree);
          local_1e8._0_4_ = local_1b4;
          local_1e8._4_4_ = UsePlacement;
          local_1e8._8_4_ = NotEvaluated;
          std::make_unique<tsbp::PackingRelaxed2D,tsbp::PackingRelaxed2D_const&>
                    ((PackingRelaxed2D *)(local_1e8 + 0x10));
          AddLeafNode(this,(Node *)local_1e8);
          Node::~Node((Node *)local_1e8);
          boost::
          add_edge<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                    (&local_208,(boost *)currentNode,local_1d0,(vertex_descriptor)&this->tree,in_R8)
          ;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&this->activeNodes,&local_1d0);
          std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                    ((optional<unsigned_long> *)&local_218,&local_1d0);
          this_local = (TwoStepBranchingProcedure *)local_218;
          newNodeId.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload = local_210;
          break;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end1);
      }
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_138);
      uVar5 = extraout_RDX_03;
    }
  }
  oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar5 >> 8);
  oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged =
       (bool)newNodeId.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_;
  oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = (_Storage<unsigned_long,_true>)this_local
  ;
  return (optional<unsigned_long>)
         oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> TwoStepBranchingProcedure::Branch(size_t nodeId)
{
    Node& currentNode = this->tree[nodeId];
    const boost::dynamic_bitset<>& placedItems = currentNode.PlacedItems();
    ////const std::unordered_set<size_t>& placedItems = currentNode.PlacedItems();

    if (currentNode.NodeStatus == BaseNode::Status::InfeasibleSequence)
    {
        return std::nullopt;
    }

    const PackingRelaxed2D& packing = *currentNode.Packing;

    // Determine number of outgoing edges.
    size_t numberOfOutgoingEdges = boost::out_degree(nodeId, this->tree);
    size_t numberOfRemainingItems = packing.PlaceableItemsAtCurrentX.count();
    ////size_t numberOfRemainingItems = items.size() - placedItems.count();

    // TODO.Logic: currently the DeactivatePlacement node is the last node that is generated. Rework to allow it to be explored in any sequence.
    ////bool isFixedSequenceDeactivation = numberOfOutgoingEdges == 1 && IsFixedSequence(currentNode, -1);
    ////if (numberOfOutgoingEdges == numberOfRemainingItems || isFixedSequenceDeactivation)
    if (numberOfOutgoingEdges == numberOfRemainingItems)
    {
        // AddDeactivatedPlacementNode()
        ////currentNode.Packing.ActiveX = currentNode.Packing.BackupX;
        ////currentNode.Packing.ActiveY = currentNode.Packing.BackupY;

        this->nodesToDeactivate.emplace(nodeId);

        if (currentNode.NodeStatus == BaseNode::Status::Root)
        {
            this->nodesToDeactivate.emplace(0);
            return std::nullopt;
        }

        if (currentNode.NodeType == BaseNode::Type::DeactivatePlacement)
        {
            return std::nullopt;
        }

        typename SearchTree::vertex_descriptor leftNodeId = boost::num_vertices(this->tree);
        AddLeafNode(Node{-1, BaseNode::Type::DeactivatePlacement, BaseNode::Status::NotEvaluated, std::make_unique<PackingRelaxed2D>(packing)});
        boost::add_edge(nodeId, leftNodeId, this->tree);

        // Caution, possible dangling reference to currentNode because the underlying graph might resize on AddLeafNode().
        // TODO.Performance: Consider using std::unique_ptr<Node> to reduce copy effort.

        this->activeNodes.push_back(leftNodeId);

        return leftNodeId;
    }

    typename SearchTree::out_edge_iterator outEdgeIterator;
    typename SearchTree::out_edge_iterator outEdgeEndIterator;
    typename SearchTree::edge_descriptor outEdge;

    boost::dynamic_bitset<> attemptedItemIds(items.size());

    for (boost::tie(outEdgeIterator, outEdgeEndIterator) = boost::out_edges(nodeId, this->tree); outEdgeIterator != outEdgeEndIterator; ++outEdgeIterator)
    {
        outEdge = *outEdgeIterator;
        typename SearchTree::vertex_descriptor targetId = boost::target(outEdge, this->tree);
        const Node& targetNode = this->tree[targetId];

        if (targetNode.ItemIdToPlace >= 0)
        {
            attemptedItemIds.set(targetNode.ItemIdToPlace);
        }
    }

    std::optional<size_t> newNodeId;
    // TODO.Logic: different branching logic, e.g. largest item or deliberately disable placement.
    ////for (size_t i = 0; i < items.size(); i++)
    for (int i: this->branchingOrder)
    {
        ////if (placedItems.contains(i) || attemptedItemIds[i])
        if (placedItems[i] || attemptedItemIds[i] || !packing.PlaceableItemsAtCurrentX[i])
        {
            continue;
        }

        /*
        if (!IsFixedSequence(currentNode, i))
        {
            continue;
        }
        */

        typename SearchTree::vertex_descriptor leftNodeId = boost::num_vertices(this->tree);
        AddLeafNode(Node{(int)i, BaseNode::Type::UsePlacement, BaseNode::Status::NotEvaluated, std::make_unique<PackingRelaxed2D>(packing)});
        boost::add_edge(nodeId, leftNodeId, this->tree);

        // Caution, possible dangling reference to currentNode because the underlying graph might resize on AddLeafNode().

        this->activeNodes.push_back(leftNodeId);
        newNodeId = leftNodeId;

        break;
    }

    return newNodeId;
}